

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclUpsizeRemoveDangling(SC_Man *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pVVar3 = pNtk->vObjs;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar3->pArray[lVar4];
      if ((((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
          ((pAVar2 = pObj->pNtk, pAVar2->ntkFunc != ABC_FUNC_MAP ||
           (((pObj->vFanins).nSize != 1 || ((pObj->field_5).pData != (void *)0x0)))))) &&
         ((pObj->vFanouts).nSize == 0)) {
        iVar1 = pObj->Id;
        if (((long)iVar1 < 0) || (pAVar2->vGates->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pAVar2->vGates->pArray[iVar1];
        if (((long)iVar1 < 0) || (*(int *)((long)pAVar2->pSCLib + 100) <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        p->SumArea = p->SumArea -
                     *(float *)(*(long *)(*(long *)((long)pAVar2->pSCLib + 0x68) + (long)iVar1 * 8)
                               + 0x18);
        Abc_NtkDeleteObj_rec(pObj,1);
        pVVar3 = pNtk->vObjs;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Abc_SclUpsizeRemoveDangling( SC_Man * p, Abc_Ntk_t * pNtk )
{
    SC_Cell * pCell;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachNodeNotBarBuf( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) == 0 )
        {
            pCell = Abc_SclObjCell( pObj );
            p->SumArea -= pCell->area;
            Abc_NtkDeleteObj_rec( pObj, 1 );
//            printf( "Removed node %d.\n", i );
        }
}